

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_msl_resource_binding_init(spvc_msl_resource_binding *binding)

{
  undefined1 local_30 [8];
  MSLResourceBinding binding_default;
  spvc_msl_resource_binding *binding_local;
  
  binding_default._24_8_ = binding;
  spirv_cross::MSLResourceBinding::MSLResourceBinding((MSLResourceBinding *)local_30);
  *(ExecutionModel *)(binding_default._24_8_ + 4) = binding_default.stage;
  *(BaseType *)(binding_default._24_8_ + 8) = binding_default.basetype;
  *(uint32_t *)(binding_default._24_8_ + 0xc) = binding_default.binding;
  *(uint32_t *)(binding_default._24_8_ + 0x10) = binding_default.count;
  *(uint32_t *)(binding_default._24_8_ + 0x14) = binding_default.msl_buffer;
  *(undefined4 *)binding_default._24_8_ = local_30._0_4_;
  return;
}

Assistant:

void spvc_msl_resource_binding_init(spvc_msl_resource_binding *binding)
{
#if SPIRV_CROSS_C_API_MSL
	MSLResourceBinding binding_default;
	binding->desc_set = binding_default.desc_set;
	binding->binding = binding_default.binding;
	binding->msl_buffer = binding_default.msl_buffer;
	binding->msl_texture = binding_default.msl_texture;
	binding->msl_sampler = binding_default.msl_sampler;
	binding->stage = static_cast<SpvExecutionModel>(binding_default.stage);
#else
	memset(binding, 0, sizeof(*binding));
#endif
}